

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldClear
          (MessageGenerator *this,FieldDescriptor *field,bool is_inline,Formatter *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor FVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  FieldGenerator *pFVar6;
  undefined7 in_register_00000011;
  char *format_00;
  string local_48;
  Hex local_28;
  
  if ((int)CONCAT71(in_register_00000011,is_inline) != 0) {
    Formatter::operator()<>(format,"inline ");
  }
  Formatter::operator()<>(format,"void $classname$::clear_$name$() {\n");
  io::Printer::Indent(format->printer_);
  lVar3 = *(long *)(field + 0x28);
  if ((lVar3 == 0 || ((byte)field[1] & 0x10) == 0) ||
     ((*(int *)(lVar3 + 4) == 1 && (lVar3 == 0 || (*(byte *)(*(long *)(lVar3 + 0x20) + 1) & 2) != 0)
      ))) {
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar6->_vptr_FieldGenerator[10])(pFVar6,format->printer_);
    FVar2 = field[1];
    if (((byte)FVar2 & 2) == 0) {
      if ((((byte)FVar2 & 0x60) == 0x20) && (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x02')) {
        if ((((byte)FVar2 & 0x10) != 0) && (*(long *)(field + 0x28) != 0)) goto LAB_002a390c;
      }
      else if (((byte)FVar2 & 0x60) != 0x40) goto LAB_002a390c;
    }
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) != '\0') goto LAB_002a390c;
    iVar4 = HasBitIndex(this,field);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"has_array_index","");
    iVar5 = iVar4 + 0x1f;
    if (-1 < iVar4) {
      iVar5 = iVar4;
    }
    local_28.value = CONCAT44(local_28.value._4_4_,iVar5 >> 5);
    Formatter::Set<int>(format,&local_48,(int *)&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"has_mask","");
    local_28.value = (uint64)(uint)(1 << ((byte)iVar4 & 0x1f));
    local_28.spec = ZERO_PAD_8;
    Formatter::Set<google::protobuf::strings::Hex>(format,&local_48,&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    format_00 = "_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n";
  }
  else {
    Formatter::operator()<>(format,"if (_internal_has_$name$()) {\n");
    io::Printer::Indent(format->printer_);
    pFVar6 = FieldGeneratorMap::get(&this->field_generators_,field);
    (*pFVar6->_vptr_FieldGenerator[10])(pFVar6,format->printer_);
    Formatter::operator()<>(format,"clear_has_$oneof_name$();\n");
    io::Printer::Outdent(format->printer_);
    format_00 = "}\n";
  }
  Formatter::operator()<>(format,format_00);
LAB_002a390c:
  Formatter::operator()<>(format,"$annotate_clear$");
  io::Printer::Outdent(format->printer_);
  Formatter::operator()<>(format,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateFieldClear(const FieldDescriptor* field,
                                          bool is_inline, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format("void $classname$::clear_$name$() { __builtin_trap(); }\n");
    return;
  }

  // Generate clear_$name$().
  if (is_inline) {
    format("inline ");
  }
  format("void $classname$::clear_$name$() {\n");

  format.Indent();

  if (field->real_containing_oneof()) {
    // Clear this field only if it is the active field in this oneof,
    // otherwise ignore
    format("if (_internal_has_$name$()) {\n");
    format.Indent();
    field_generators_.get(field).GenerateClearingCode(format.printer());
    format("clear_has_$oneof_name$();\n");
    format.Outdent();
    format("}\n");
  } else {
    field_generators_.get(field).GenerateClearingCode(format.printer());
    if (HasHasbit(field)) {
      int has_bit_index = HasBitIndex(field);
      format.Set("has_array_index", has_bit_index / 32);
      format.Set("has_mask",
                 strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
      format("_has_bits_[$has_array_index$] &= ~0x$has_mask$u;\n");
    }
  }
  format("$annotate_clear$");
  format.Outdent();
  format("}\n");
}